

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

int __thiscall
zmq::thread_ctx_t::get(thread_ctx_t *this,int option_,void *optval_,size_t *optvallen_)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  scoped_lock_t locker;
  scoped_lock_t local_20;
  
  uVar1 = *optvallen_;
  if (option_ == 9) {
    if (uVar1 != 4) {
      if (uVar1 < (this->_thread_name_prefix)._M_string_length) goto LAB_00177011;
      scoped_lock_t::scoped_lock_t(&local_20,&this->_opt_sync);
      memcpy(optval_,(this->_thread_name_prefix)._M_dataplus._M_p,
             (this->_thread_name_prefix)._M_string_length);
      goto LAB_00176fff;
    }
    scoped_lock_t::scoped_lock_t(&local_20,&this->_opt_sync);
    iVar2 = atoi((this->_thread_name_prefix)._M_dataplus._M_p);
  }
  else {
    if ((option_ != 4) || (uVar1 != 4)) {
LAB_00177011:
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      return -1;
    }
    scoped_lock_t::scoped_lock_t(&local_20,&this->_opt_sync);
    iVar2 = this->_thread_sched_policy;
  }
  *(int *)optval_ = iVar2;
LAB_00176fff:
  scoped_lock_t::~scoped_lock_t(&local_20);
  return 0;
}

Assistant:

int zmq::thread_ctx_t::get (int option_,
                            void *optval_,
                            const size_t *optvallen_)
{
    const bool is_int = (*optvallen_ == sizeof (int));
    int *value = static_cast<int *> (optval_);

    switch (option_) {
        case ZMQ_THREAD_SCHED_POLICY:
            if (is_int) {
                scoped_lock_t locker (_opt_sync);
                *value = _thread_sched_policy;
                return 0;
            }
            break;

        case ZMQ_THREAD_NAME_PREFIX:
            if (is_int) {
                scoped_lock_t locker (_opt_sync);
                *value = atoi (_thread_name_prefix.c_str ());
                return 0;
            } else if (*optvallen_ >= _thread_name_prefix.size ()) {
                scoped_lock_t locker (_opt_sync);
                memcpy (optval_, _thread_name_prefix.data (),
                        _thread_name_prefix.size ());
                return 0;
            }
            break;
    }

    errno = EINVAL;
    return -1;
}